

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.h
# Opt level: O2

query<int,_std::vector<char,_std::allocator<char>_>_> * __thiscall
sqlib::query<int,_std::vector<char,_std::allocator<char>_>_>::operator++
          (query<int,_std::vector<char,_std::allocator<char>_>_> *this)

{
  column_extractor ex;
  column_extractor local_18;
  
  step(this);
  if (this->m_has_data == true) {
    local_18.m_prepared = (this->super_statement_base).m_prepared;
    local_18.m_row = &this->m_row;
    for_iter<0,2>::fun<sqlib::query<int,std::vector<char,std::allocator<char>>>::column_extractor>
              (&local_18);
  }
  return this;
}

Assistant:

query& operator++() {
    step();
    if(m_has_data) {
      column_extractor ex(m_prepared, m_row);
      ct_for<sizeof...(Cols)>(ex);
    }
    return *this;
  }